

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

exit_table_type<const_afsm::none_&> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::vending_def::on::serving,unsigned_long>
::exit_table<afsm::none_const&,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  if (exit_table<afsm::none_const&,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)::_table ==
      '\0') {
    exit_table<afsm::none_const&,0ul,1ul>();
  }
  return &state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
          ::exit_table<const_afsm::none_&,_0UL,_1UL>::_table;
}

Assistant:

static exit_table_type<Event> const&
    exit_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static exit_table_type<Event> _table {{
            detail::final_state_exit_func<Indexes>{} ...
        }};
        return _table;
    }